

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_> *field)

{
  pointer pSVar1;
  unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> local_28;
  value_type local_20;
  unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_> *local_18;
  unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_> *field_local;
  Module *this_local;
  
  local_18 = field;
  field_local = (unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_> *)
                this;
  pSVar1 = std::unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>::
           operator->(field);
  local_20 = &pSVar1->start;
  std::vector<wabt::Var_*,_std::allocator<wabt::Var_*>_>::push_back(&this->starts,&local_20);
  std::unique_ptr<wabt::ModuleField,std::default_delete<wabt::ModuleField>>::
  unique_ptr<wabt::StartModuleField,std::default_delete<wabt::StartModuleField>,void>
            ((unique_ptr<wabt::ModuleField,std::default_delete<wabt::ModuleField>> *)&local_28,field
            );
  intrusive_list<wabt::ModuleField>::push_back(&this->fields,&local_28);
  std::unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>::~unique_ptr
            (&local_28);
  return;
}

Assistant:

void Module::AppendField(std::unique_ptr<StartModuleField> field) {
  starts.push_back(&field->start);
  fields.push_back(std::move(field));
}